

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::rc::TextureCubeArray::sample4
          (TextureCubeArray *this,Vec4 *output,Vec4 *packetTexcoords,float lodBias)

{
  int iVar1;
  CubeFace face_00;
  float fVar2;
  float fVar3;
  float r;
  float q;
  Vec2 *local_f0;
  Vector<float,_2> *local_e8;
  undefined1 local_d8 [24];
  float lod;
  float p;
  float mv;
  float mu;
  Vec2 *dFdy;
  Vec2 *dFdx;
  Vec2 dFdy1;
  Vec2 dFdy0;
  Vec2 dFdx1;
  Vec2 dFdx0;
  Vec2 faceCoords [4];
  uint local_5c;
  CubeFace face;
  int fragNdx;
  Vec3 cubeCoords [4];
  float cubeSide;
  float lodBias_local;
  Vec4 *packetTexcoords_local;
  Vec4 *output_local;
  TextureCubeArray *this_local;
  
  cubeCoords[3].m_data[2] = lodBias;
  iVar1 = tcu::TextureCubeArrayView::getSize(&this->m_view);
  cubeCoords[3].m_data[1] = (float)iVar1;
  tcu::Vector<float,_4>::toWidth<3>((Vector<float,_4> *)&face);
  tcu::Vector<float,_4>::toWidth<3>((Vector<float,_4> *)(cubeCoords[0].m_data + 1));
  tcu::Vector<float,_4>::toWidth<3>((Vector<float,_4> *)(cubeCoords[1].m_data + 1));
  tcu::Vector<float,_4>::toWidth<3>((Vector<float,_4> *)(cubeCoords[2].m_data + 1));
  for (local_5c = 0; (int)local_5c < 4; local_5c = local_5c + 1) {
    face_00 = tcu::selectCubeFace((Vec3 *)(&face + (long)(int)local_5c * 3));
    tcu::projectToFace((tcu *)&dFdx0,face_00,(Vec3 *)&face);
    tcu::projectToFace((tcu *)faceCoords,face_00,(Vec3 *)(cubeCoords[0].m_data + 1));
    tcu::projectToFace((tcu *)(faceCoords + 1),face_00,(Vec3 *)(cubeCoords[1].m_data + 1));
    tcu::projectToFace((tcu *)(faceCoords + 2),face_00,(Vec3 *)(cubeCoords[2].m_data + 1));
    tcu::operator-((tcu *)&dFdx1,faceCoords,&dFdx0);
    tcu::operator-((tcu *)&dFdy0,faceCoords + 2,faceCoords + 1);
    tcu::operator-((tcu *)&dFdy1,faceCoords + 1,&dFdx0);
    tcu::operator-((tcu *)&dFdx,faceCoords + 2,faceCoords);
    if ((local_5c & 2) == 0) {
      local_e8 = &dFdx1;
    }
    else {
      local_e8 = &dFdy0;
    }
    dFdy = local_e8;
    if ((local_5c & 1) == 0) {
      local_f0 = &dFdy1;
    }
    else {
      local_f0 = (Vec2 *)&dFdx;
    }
    _mv = local_f0;
    fVar2 = tcu::Vector<float,_2>::x(local_e8);
    fVar2 = de::abs<float>(fVar2);
    fVar3 = tcu::Vector<float,_2>::x(_mv);
    fVar3 = de::abs<float>(fVar3);
    p = de::max<float>(fVar2,fVar3);
    fVar2 = tcu::Vector<float,_2>::y(dFdy);
    fVar2 = de::abs<float>(fVar2);
    fVar3 = tcu::Vector<float,_2>::y(_mv);
    fVar3 = de::abs<float>(fVar3);
    lod = de::max<float>(fVar2,fVar3);
    local_d8._20_4_ = de::max<float>(p * cubeCoords[3].m_data[1],lod * cubeCoords[3].m_data[1]);
    local_d8._16_4_ = deFloatLog2((float)local_d8._20_4_);
    local_d8._16_4_ = (float)local_d8._16_4_ + cubeCoords[3].m_data[2];
    fVar2 = tcu::Vector<float,_4>::x(packetTexcoords + (int)local_5c);
    fVar3 = tcu::Vector<float,_4>::y(packetTexcoords + (int)local_5c);
    r = tcu::Vector<float,_4>::z(packetTexcoords + (int)local_5c);
    q = tcu::Vector<float,_4>::w(packetTexcoords + (int)local_5c);
    sample((TextureCubeArray *)local_d8,fVar2,fVar3,r,q,(float)local_d8._16_4_);
    *(undefined8 *)output[(int)local_5c].m_data = local_d8._0_8_;
    *(undefined8 *)(output[(int)local_5c].m_data + 2) = local_d8._8_8_;
  }
  return;
}

Assistant:

void TextureCubeArray::sample4 (tcu::Vec4 output[4], const tcu::Vec4 packetTexcoords[4], float lodBias) const
{
	const float		cubeSide		= (float)m_view.getSize();
	const tcu::Vec3	cubeCoords[4]	=
	{
		packetTexcoords[0].toWidth<3>(),
		packetTexcoords[1].toWidth<3>(),
		packetTexcoords[2].toWidth<3>(),
		packetTexcoords[3].toWidth<3>()
	};

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::CubeFace face			= tcu::selectCubeFace(cubeCoords[fragNdx]);
		const tcu::Vec2		faceCoords[4]	=
		{
			tcu::projectToFace(face, cubeCoords[0]),
			tcu::projectToFace(face, cubeCoords[1]),
			tcu::projectToFace(face, cubeCoords[2]),
			tcu::projectToFace(face, cubeCoords[3]),
		};

		const tcu::Vec2 dFdx0 = faceCoords[1] - faceCoords[0];
		const tcu::Vec2 dFdx1 = faceCoords[3] - faceCoords[2];
		const tcu::Vec2 dFdy0 = faceCoords[2] - faceCoords[0];
		const tcu::Vec2 dFdy1 = faceCoords[3] - faceCoords[1];

		const tcu::Vec2& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec2& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float p = de::max(mu * cubeSide, mv * cubeSide);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), packetTexcoords[fragNdx].z(), packetTexcoords[fragNdx].w(), lod);
	}
}